

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O0

SQInteger __thiscall SQLexer::Lex(SQLexer *this)

{
  byte bVar1;
  int iVar2;
  SQInteger SVar3;
  SQInteger c;
  SQInteger t;
  SQInteger ret_1;
  SQInteger ret;
  SQInteger stype_1;
  SQInteger stype;
  SQLexer *this_local;
  
  this->_lasttokenline = this->_currentline;
  do {
    if (this->_currdata == '\0') {
      return 0;
    }
    switch(this->_currdata) {
    default:
      iVar2 = isdigit((uint)this->_currdata);
      if (iVar2 != 0) {
        SVar3 = ReadNumber(this);
        this->_prevtoken = this->_curtoken;
        this->_curtoken = SVar3;
        return SVar3;
      }
      iVar2 = isalpha((uint)this->_currdata);
      if ((iVar2 == 0) && (this->_currdata != '_')) {
        bVar1 = this->_currdata;
        iVar2 = iscntrl((uint)bVar1);
        if (iVar2 != 0) {
          Error(this,"unexpected character(control)");
        }
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        this->_prevtoken = this->_curtoken;
        this->_curtoken = (ulong)bVar1;
        return (ulong)bVar1;
      }
      SVar3 = ReadID(this);
      this->_prevtoken = this->_curtoken;
      this->_curtoken = SVar3;
      return SVar3;
    case '\t':
    case '\r':
    case ' ':
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      break;
    case '\n':
      this->_currentline = this->_currentline + 1;
      this->_prevtoken = this->_curtoken;
      this->_curtoken = 10;
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      this->_currentcolumn = 1;
      break;
    case '!':
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      if (this->_currdata != '=') {
        this->_prevtoken = this->_curtoken;
        this->_curtoken = 0x21;
        return 0x21;
      }
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      this->_prevtoken = this->_curtoken;
      this->_curtoken = 0x109;
      return 0x109;
    case '#':
      LexLineComment(this);
      break;
    case '%':
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      if (this->_currdata == '=') {
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        this->_prevtoken = this->_curtoken;
        this->_curtoken = 0x13f;
        return 0x13f;
      }
      this->_prevtoken = this->_curtoken;
      this->_curtoken = 0x25;
      return 0x25;
    case '&':
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      if (this->_currdata != '&') {
        this->_prevtoken = this->_curtoken;
        this->_curtoken = 0x26;
        return 0x26;
      }
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      this->_prevtoken = this->_curtoken;
      this->_curtoken = 0x10e;
      return 0x10e;
    case '*':
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      if (this->_currdata == '=') {
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        this->_prevtoken = this->_curtoken;
        this->_curtoken = 0x13d;
        return 0x13d;
      }
      this->_prevtoken = this->_curtoken;
      this->_curtoken = 0x2a;
      return 0x2a;
    case '+':
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      if (this->_currdata == '=') {
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        this->_prevtoken = this->_curtoken;
        this->_curtoken = 0x121;
        return 0x121;
      }
      if (this->_currdata == '+') {
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        this->_prevtoken = this->_curtoken;
        this->_curtoken = 0x12f;
        return 0x12f;
      }
      this->_prevtoken = this->_curtoken;
      this->_curtoken = 0x2b;
      return 0x2b;
    case '-':
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      if (this->_currdata == '=') {
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        this->_prevtoken = this->_curtoken;
        this->_curtoken = 0x122;
        return 0x122;
      }
      if (this->_currdata == '-') {
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        this->_prevtoken = this->_curtoken;
        this->_curtoken = 0x130;
        return 0x130;
      }
      this->_prevtoken = this->_curtoken;
      this->_curtoken = 0x2d;
      return 0x2d;
    case '.':
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      if (this->_currdata != '.') {
        this->_prevtoken = this->_curtoken;
        this->_curtoken = 0x2e;
        return 0x2e;
      }
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      if (this->_currdata != '.') {
        Error(this,"invalid token \'..\'");
      }
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      this->_prevtoken = this->_curtoken;
      this->_curtoken = 0x138;
      return 0x138;
    case '/':
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      switch(this->_currdata) {
      case '*':
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        LexBlockComment(this);
        break;
      default:
        this->_prevtoken = this->_curtoken;
        this->_curtoken = 0x2f;
        return 0x2f;
      case '/':
        LexLineComment(this);
        break;
      case '=':
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        this->_prevtoken = this->_curtoken;
        this->_curtoken = 0x13e;
        return 0x13e;
      case '>':
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        this->_prevtoken = this->_curtoken;
        this->_curtoken = 0x141;
        return 0x141;
      }
      break;
    case ':':
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      if (this->_currdata != ':') {
        this->_prevtoken = this->_curtoken;
        this->_curtoken = 0x3a;
        return 0x3a;
      }
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      this->_prevtoken = this->_curtoken;
      this->_curtoken = 299;
      return 299;
    case '<':
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      switch(this->_currdata) {
      case '-':
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        this->_prevtoken = this->_curtoken;
        this->_curtoken = 0x119;
        return 0x119;
      default:
        this->_prevtoken = this->_curtoken;
        this->_curtoken = 0x3c;
        return 0x3c;
      case '/':
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        this->_prevtoken = this->_curtoken;
        this->_curtoken = 0x140;
        return 0x140;
      case '<':
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        this->_prevtoken = this->_curtoken;
        this->_curtoken = 0x128;
        return 0x128;
      case '=':
        goto switchD_0012c54f_caseD_3d;
      }
    case '=':
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      if (this->_currdata != '=') {
        this->_prevtoken = this->_curtoken;
        this->_curtoken = 0x3d;
        return 0x3d;
      }
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      this->_prevtoken = this->_curtoken;
      this->_curtoken = 0x108;
      return 0x108;
    case '>':
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      if (this->_currdata == '=') {
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        this->_prevtoken = this->_curtoken;
        this->_curtoken = 0x10b;
        return 0x10b;
      }
      if (this->_currdata == '>') {
        Next(this);
        this->_currentcolumn = this->_currentcolumn + 1;
        if (this->_currdata == '>') {
          Next(this);
          this->_currentcolumn = this->_currentcolumn + 1;
          this->_prevtoken = this->_curtoken;
          this->_curtoken = 0x132;
          return 0x132;
        }
        this->_prevtoken = this->_curtoken;
        this->_curtoken = 0x129;
        return 0x129;
      }
      this->_prevtoken = this->_curtoken;
      this->_curtoken = 0x3e;
      return 0x3e;
    case '@':
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      if (this->_currdata != '\"') {
        this->_prevtoken = this->_curtoken;
        this->_curtoken = 0x40;
        return 0x40;
      }
      SVar3 = ReadString(this,0x22,true);
      if (SVar3 != -1) {
        this->_prevtoken = this->_curtoken;
        this->_curtoken = SVar3;
        return SVar3;
      }
      Error(this,"error parsing the string");
    case '\"':
    case '\'':
      SVar3 = ReadString(this,(ulong)this->_currdata,false);
      if (SVar3 != -1) {
        this->_prevtoken = this->_curtoken;
        this->_curtoken = SVar3;
        return SVar3;
      }
      Error(this,"error parsing the string");
    case '(':
    case ')':
    case ',':
    case ';':
    case '?':
    case '[':
    case ']':
    case '^':
    case '{':
    case '}':
    case '~':
      bVar1 = this->_currdata;
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      this->_prevtoken = this->_curtoken;
      this->_curtoken = (ulong)bVar1;
      return (ulong)bVar1;
    case '|':
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      if (this->_currdata != '|') {
        this->_prevtoken = this->_curtoken;
        this->_curtoken = 0x7c;
        return 0x7c;
      }
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      this->_prevtoken = this->_curtoken;
      this->_curtoken = 0x10f;
      return 0x10f;
    }
  } while( true );
switchD_0012c54f_caseD_3d:
  Next(this);
  this->_currentcolumn = this->_currentcolumn + 1;
  if (this->_currdata == '>') {
    Next(this);
    this->_currentcolumn = this->_currentcolumn + 1;
    this->_prevtoken = this->_curtoken;
    this->_curtoken = 0x131;
    return 0x131;
  }
  this->_prevtoken = this->_curtoken;
  this->_curtoken = 0x10a;
  return 0x10a;
}

Assistant:

SQInteger SQLexer::Lex()
{
    _lasttokenline = _currentline;
    while(CUR_CHAR != SQUIRREL_EOB) {
        switch(CUR_CHAR){
        case _SC('\t'): case _SC('\r'): case _SC(' '): NEXT(); continue;
        case _SC('\n'):
            _currentline++;
            _prevtoken=_curtoken;
            _curtoken=_SC('\n');
            NEXT();
            _currentcolumn=1;
            continue;
        case _SC('#'): LexLineComment(); continue;
        case _SC('/'):
            NEXT();
            switch(CUR_CHAR){
            case _SC('*'):
                NEXT();
                LexBlockComment();
                continue;
            case _SC('/'):
                LexLineComment();
                continue;
            case _SC('='):
                NEXT();
                RETURN_TOKEN(TK_DIVEQ);
                continue;
            case _SC('>'):
                NEXT();
                RETURN_TOKEN(TK_ATTR_CLOSE);
                continue;
            default:
                RETURN_TOKEN('/');
            }
        case _SC('='):
            NEXT();
            if (CUR_CHAR != _SC('=')){ RETURN_TOKEN('=') }
            else { NEXT(); RETURN_TOKEN(TK_EQ); }
        case _SC('<'):
            NEXT();
            switch(CUR_CHAR) {
            case _SC('='):
                NEXT();
                if(CUR_CHAR == _SC('>')) {
                    NEXT();
                    RETURN_TOKEN(TK_3WAYSCMP);
                }
                RETURN_TOKEN(TK_LE)
                break;
            case _SC('-'): NEXT(); RETURN_TOKEN(TK_NEWSLOT); break;
            case _SC('<'): NEXT(); RETURN_TOKEN(TK_SHIFTL); break;
            case _SC('/'): NEXT(); RETURN_TOKEN(TK_ATTR_OPEN); break;
            }
            RETURN_TOKEN('<');
        case _SC('>'):
            NEXT();
            if (CUR_CHAR == _SC('=')){ NEXT(); RETURN_TOKEN(TK_GE);}
            else if(CUR_CHAR == _SC('>')){
                NEXT();
                if(CUR_CHAR == _SC('>')){
                    NEXT();
                    RETURN_TOKEN(TK_USHIFTR);
                }
                RETURN_TOKEN(TK_SHIFTR);
            }
            else { RETURN_TOKEN('>') }
        case _SC('!'):
            NEXT();
            if (CUR_CHAR != _SC('=')){ RETURN_TOKEN('!')}
            else { NEXT(); RETURN_TOKEN(TK_NE); }
        case _SC('@'): {
            SQInteger stype;
            NEXT();
            if(CUR_CHAR != _SC('"')) {
                RETURN_TOKEN('@');
            }
            if((stype=ReadString('"',true))!=-1) {
                RETURN_TOKEN(stype);
            }
            Error(_SC("error parsing the string"));
                       }
        case _SC('"'):
        case _SC('\''): {
            SQInteger stype;
            if((stype=ReadString(CUR_CHAR,false))!=-1){
                RETURN_TOKEN(stype);
            }
            Error(_SC("error parsing the string"));
            }
        case _SC('{'): case _SC('}'): case _SC('('): case _SC(')'): case _SC('['): case _SC(']'):
        case _SC(';'): case _SC(','): case _SC('?'): case _SC('^'): case _SC('~'):
            {SQInteger ret = CUR_CHAR;
            NEXT(); RETURN_TOKEN(ret); }
        case _SC('.'):
            NEXT();
            if (CUR_CHAR != _SC('.')){ RETURN_TOKEN('.') }
            NEXT();
            if (CUR_CHAR != _SC('.')){ Error(_SC("invalid token '..'")); }
            NEXT();
            RETURN_TOKEN(TK_VARPARAMS);
        case _SC('&'):
            NEXT();
            if (CUR_CHAR != _SC('&')){ RETURN_TOKEN('&') }
            else { NEXT(); RETURN_TOKEN(TK_AND); }
        case _SC('|'):
            NEXT();
            if (CUR_CHAR != _SC('|')){ RETURN_TOKEN('|') }
            else { NEXT(); RETURN_TOKEN(TK_OR); }
        case _SC(':'):
            NEXT();
            if (CUR_CHAR != _SC(':')){ RETURN_TOKEN(':') }
            else { NEXT(); RETURN_TOKEN(TK_DOUBLE_COLON); }
        case _SC('*'):
            NEXT();
            if (CUR_CHAR == _SC('=')){ NEXT(); RETURN_TOKEN(TK_MULEQ);}
            else RETURN_TOKEN('*');
        case _SC('%'):
            NEXT();
            if (CUR_CHAR == _SC('=')){ NEXT(); RETURN_TOKEN(TK_MODEQ);}
            else RETURN_TOKEN('%');
        case _SC('-'):
            NEXT();
            if (CUR_CHAR == _SC('=')){ NEXT(); RETURN_TOKEN(TK_MINUSEQ);}
            else if  (CUR_CHAR == _SC('-')){ NEXT(); RETURN_TOKEN(TK_MINUSMINUS);}
            else RETURN_TOKEN('-');
        case _SC('+'):
            NEXT();
            if (CUR_CHAR == _SC('=')){ NEXT(); RETURN_TOKEN(TK_PLUSEQ);}
            else if (CUR_CHAR == _SC('+')){ NEXT(); RETURN_TOKEN(TK_PLUSPLUS);}
            else RETURN_TOKEN('+');
        case SQUIRREL_EOB:
            return 0;
        default:{
                if (scisdigit(CUR_CHAR)) {
                    SQInteger ret = ReadNumber();
                    RETURN_TOKEN(ret);
                }
                else if (scisalpha(CUR_CHAR) || CUR_CHAR == _SC('_')) {
                    SQInteger t = ReadID();
                    RETURN_TOKEN(t);
                }
                else {
                    SQInteger c = CUR_CHAR;
                    if (sciscntrl((int)c)) Error(_SC("unexpected character(control)"));
                    NEXT();
                    RETURN_TOKEN(c);
                }
                RETURN_TOKEN(0);
            }
        }
    }
    return 0;
}